

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aloptional.h
# Opt level: O0

void __thiscall
al::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
~optional(optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *this)

{
  byte *in_RDI;
  
  if ((*in_RDI & 1) != 0) {
    destroy_at<std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x17d0b6);
  }
  return;
}

Assistant:

~optional() { if(mHasValue) al::destroy_at(std::addressof(mValue)); }